

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void * list_split_new(t_floatarg f)

{
  t_object *owner;
  _outlet *p_Var1;
  
  owner = (t_object *)pd_new(list_split_class);
  p_Var1 = outlet_new(owner,&s_list);
  owner[1].te_g.g_next = (_gobj *)p_Var1;
  p_Var1 = outlet_new(owner,&s_list);
  owner[1].te_binbuf = (_binbuf *)p_Var1;
  p_Var1 = outlet_new(owner,&s_list);
  owner[1].te_outlet = p_Var1;
  floatinlet_new(owner,(t_float *)(owner + 1));
  *(t_floatarg *)&owner[1].te_g.g_pd = f;
  return owner;
}

Assistant:

static void *list_split_new(t_floatarg f)
{
    t_list_split *x = (t_list_split *)pd_new(list_split_class);
    x->x_out1 = outlet_new(&x->x_obj, &s_list);
    x->x_out2 = outlet_new(&x->x_obj, &s_list);
    x->x_out3 = outlet_new(&x->x_obj, &s_list);
    floatinlet_new(&x->x_obj, &x->x_f);
    x->x_f = f;
    return (x);
}